

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle_fekete_rule.cpp
# Opt level: O3

void fekete_subrule_2(int suborder_num,double *suborder_xyz,double *suborder_w)

{
  undefined8 uVar1;
  long lVar2;
  
  if (0 < suborder_num) {
    lVar2 = 0;
    do {
      uVar1 = *(undefined8 *)((long)fekete_subrule_2::suborder_xy_rule_2 + lVar2 + 8);
      *(undefined8 *)((long)suborder_xyz + lVar2) =
           *(undefined8 *)((long)fekete_subrule_2::suborder_xy_rule_2 + lVar2);
      ((undefined8 *)((long)suborder_xyz + lVar2))[1] = uVar1;
      *(undefined8 *)((long)suborder_xyz + lVar2 + 0x10) =
           *(undefined8 *)((long)fekete_subrule_2::suborder_xy_rule_2 + lVar2 + 0x10);
      lVar2 = lVar2 + 0x18;
    } while ((ulong)(uint)suborder_num * 0x18 != lVar2);
    if (0 < suborder_num) {
      memcpy(suborder_w,fekete_subrule_2::suborder_w_rule_2,(ulong)(uint)suborder_num << 3);
      return;
    }
  }
  return;
}

Assistant:

void fekete_subrule_2 ( int suborder_num, double suborder_xyz[], 
  double suborder_w[] )

//****************************************************************************80
//
//  Purpose:
//
//    FEKETE_SUBRULE_2 returns a compressed Fekete rule 2.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 December 2006
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Mark Taylor, Beth Wingate, Rachel Vincent,
//    An Algorithm for Computing Fekete Points in the Triangle,
//    SIAM Journal on Numerical Analysis,
//    Volume 38, Number 5, 2000, pages 1707-1720.
//
//  Parameters:
//
//    Input, int SUBORDER_NUM, the number of suborders of the rule.
//
//    Output, double SUBORDER_XYZ[3*SUBORDER_NUM],
//    the barycentric coordinates of the abscissas.
//
//    Output, double SUBORDER_W[SUBORDER_NUM], the suborder weights.
//
{
  int s;
  static double suborder_xy_rule_2[3*7] = {
      0.3333333333,  0.3333333333, 0.3333333334, 
      0.1063354684,  0.1063354684, 0.7873290632, 
      0.5000000000,  0.5000000000, 0.0000000000, 
      1.0000000000,  0.0000000000, 0.0000000000, 
      0.1171809171,  0.3162697959, 0.5665492870, 
      0.0000000000,  0.2655651402, 0.7344348598, 
      0.0000000000,  0.0848854223, 0.9151145777 };
  static double suborder_w_rule_2[7] = {
      0.2178563571, 
      0.1104193374, 
      0.0358939762, 
      0.0004021278, 
      0.1771348660, 
      0.0272344079, 
      0.0192969460 };

  for ( s = 0; s < suborder_num; s++ )
  {
    suborder_xyz[0+s*3] = suborder_xy_rule_2[0+s*3];
    suborder_xyz[1+s*3] = suborder_xy_rule_2[1+s*3];
    suborder_xyz[2+s*3] = suborder_xy_rule_2[2+s*3];
  }

  for ( s = 0; s < suborder_num; s++ )
  {
    suborder_w[s] = suborder_w_rule_2[s];
  }

  return;
}